

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

IEngineGraphics * CreateEngineGraphicsThreaded(void)

{
  IEngineGraphics *pIVar1;
  CGraphics_Threaded *unaff_retaddr;
  
  pIVar1 = (IEngineGraphics *)operator_new(0x1241b8);
  CGraphics_Threaded::CGraphics_Threaded(unaff_retaddr);
  return pIVar1;
}

Assistant:

extern IEngineGraphics *CreateEngineGraphicsThreaded()
{
#ifdef CONF_HEADLESS_CLIENT
	return new CGraphics_ThreadedNull();
#else
	return new CGraphics_Threaded();
#endif
}